

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O1

int i2cProcessCall(uint handle,uint reg,uint wVal)

{
  FILE *__stream;
  int iVar1;
  uint uVar2;
  my_smbus_data data;
  my_smbus_data local_42;
  
  __stream = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    fprintf(__stream,"%s %s: handle=%d reg=%d wVal=%d\n",myTimeStamp::buf,"i2cProcessCall",
            (ulong)handle,reg,wVal);
  }
  if (libInitialised == '\0') {
    uVar2 = 0xffffffe1;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      i2cProcessCall_cold_1();
    }
  }
  else if (handle < 0x40) {
    if (i2cInfo[handle].state == 2) {
      if ((i2cInfo[handle].funcs & 0x800000) == 0) {
        uVar2 = 0xffffff95;
        if ((gpioCfg.internals >> 10 & 1) == 0) {
          i2cProcessCall_cold_6();
        }
      }
      else if (reg < 0x100) {
        if (wVal < 0x10000) {
          local_42.word = (uint16_t)wVal;
          iVar1 = my_smbus_access((int)i2cInfo[handle].fd,'\0',(uint8_t)reg,4,&local_42);
          if (iVar1 < 0) {
            uVar2 = 0xffffffad;
            if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
              i2cProcessCall_cold_3();
            }
          }
          else {
            uVar2 = (uint)local_42.word;
          }
        }
        else {
          uVar2 = 0xffffffaf;
          if ((gpioCfg.internals >> 10 & 1) == 0) {
            i2cProcessCall_cold_4();
          }
        }
      }
      else {
        uVar2 = 0xffffffaf;
        if ((gpioCfg.internals >> 10 & 1) == 0) {
          i2cProcessCall_cold_5();
        }
      }
    }
    else {
      uVar2 = 0xffffffe7;
      if ((gpioCfg.internals >> 10 & 1) == 0) {
        i2cProcessCall_cold_2();
      }
    }
  }
  else {
    uVar2 = 0xffffffe7;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      i2cProcessCall_cold_7();
    }
  }
  return uVar2;
}

Assistant:

int i2cProcessCall(unsigned handle, unsigned reg, unsigned wVal)
{
   union my_smbus_data data;
   int status;

   DBG(DBG_USER, "handle=%d reg=%d wVal=%d", handle, reg, wVal);

   CHECK_INITED;

   if (handle >= PI_I2C_SLOTS)
      SOFT_ERROR(PI_BAD_HANDLE, "bad handle (%d)", handle);

   if (i2cInfo[handle].state != PI_I2C_OPENED)
      SOFT_ERROR(PI_BAD_HANDLE, "bad handle (%d)", handle);

   if ((i2cInfo[handle].funcs & PI_I2C_FUNC_SMBUS_PROC_CALL) == 0)
      SOFT_ERROR(PI_BAD_SMBUS_CMD, "SMBUS command not supported by driver");

   if (reg > 0xFF)
      SOFT_ERROR(PI_BAD_PARAM, "bad reg (%d)", reg);

   if (wVal > 0xFFFF)
      SOFT_ERROR(PI_BAD_PARAM, "bad wVal (%d)", wVal);

   data.word = wVal;

   status = (my_smbus_access(
      i2cInfo[handle].fd,
      PI_I2C_SMBUS_WRITE,
      reg, PI_I2C_SMBUS_PROC_CALL,
      &data));

   if (status < 0)
   {
      DBG(DBG_USER, "error=%d (%m)", status);
      return PI_I2C_READ_FAILED;
   }

   return 0xFFFF & data.word;
}